

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVCVTQ(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint uVar2;
  
  uVar2 = Insn >> 5 & 1;
  if ((Insn & 0x380f00) == 0xf00) {
    DVar1 = MCDisassembler_Fail;
    if (uVar2 == 0) {
      MCInst_setOpcode(Inst,0x559);
      DVar1 = DecodeNEONModImmInstruction(Inst,Insn,Address_00,Decoder);
      return DVar1;
    }
  }
  else {
    DVar1 = MCDisassembler_Fail;
    if ((Insn & 0x201000) == 0x200000) {
      MCOperand_CreateReg0(Inst,(uint)QPRDecoderTable[Insn >> 0x13 & 8 | Insn >> 0xd & 7]);
      if ((Insn & 1) == 0) {
        MCOperand_CreateReg0
                  (Inst,(uint)*(ushort *)((long)QPRDecoderTable + (ulong)(uVar2 << 4 | Insn & 0xe)))
        ;
        MCOperand_CreateImm0(Inst,(ulong)(0x40 - (Insn >> 0x10 & 0x3f)));
        DVar1 = MCDisassembler_Success;
      }
    }
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeVCVTQ(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Vm, imm, cmode, op;
	unsigned Vd = (fieldFromInstruction_4(Insn, 12, 4) << 0);
	Vd |= (fieldFromInstruction_4(Insn, 22, 1) << 4);
	Vm = (fieldFromInstruction_4(Insn, 0, 4) << 0);
	Vm |= (fieldFromInstruction_4(Insn, 5, 1) << 4);
	imm = fieldFromInstruction_4(Insn, 16, 6);
	cmode = fieldFromInstruction_4(Insn, 8, 4);
	op = fieldFromInstruction_4(Insn, 5, 1);

	// VMOVv4f32 is ambiguous with these decodings.
	if (!(imm & 0x38) && cmode == 0xF) {
		if (op == 1) return MCDisassembler_Fail;
		MCInst_setOpcode(Inst, ARM_VMOVv4f32);
		return DecodeNEONModImmInstruction(Inst, Insn, Address, Decoder);
	}

	if (!(imm & 0x20)) return MCDisassembler_Fail;

	if (!Check(&S, DecodeQPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeQPRRegisterClass(Inst, Vm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 64 - imm);

	return S;
}